

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testPreviewImage.cpp
# Opt level: O3

void testPreviewImage(string *tempDir)

{
  pointer pcVar1;
  PreviewRgba *pPVar2;
  long *plVar3;
  long *__s;
  bool bVar4;
  int iVar5;
  int iVar6;
  PreviewRgba PVar7;
  Header *pHVar8;
  Box2i *pBVar9;
  ushort *puVar10;
  size_t sVar11;
  PreviewImage *pPVar12;
  Box2i *pBVar13;
  ushort *puVar14;
  int x;
  PreviewRgba PVar15;
  int y;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int iVar19;
  size_t sVar20;
  PreviewImage preview1;
  string filename2;
  string filename1;
  RgbaInputFile file1;
  Header header;
  RgbaOutputFile file2;
  PreviewImage local_4e0;
  long *local_4d0 [2];
  long local_4c0 [2];
  Rgba *local_4b0;
  long *local_4a8 [2];
  long local_498 [2];
  long *local_488;
  size_t local_480;
  RgbaInputFile local_478;
  undefined1 local_440 [520];
  RgbaOutputFile local_238;
  byte abStack_218 [488];
  
  local_4a8[0] = local_498;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4a8,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_4a8);
  local_4d0[0] = local_4c0;
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d0,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_4d0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing preview image attribute",0x1f);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  __s = local_4a8[0];
  plVar3 = local_4d0[0];
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file ",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/comp_piz.exr"
             ,0x80);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  iVar5 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile
            (&local_478,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/comp_piz.exr"
             ,iVar5);
  pHVar8 = Imf_2_5::RgbaInputFile::header(&local_478);
  bVar4 = Imf_2_5::Header::hasPreviewImage(pHVar8);
  if (bVar4) {
    __assert_fail("!file1.header().hasPreviewImage()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                  ,0x58,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  pBVar9 = Imf_2_5::RgbaInputFile::dataWindow(&local_478);
  lVar16 = (long)(pBVar9->min).x;
  sVar20 = ((pBVar9->max).x - lVar16) + 1;
  iVar5 = (pBVar9->min).y;
  iVar6 = (((pBVar9->max).y - iVar5) + 1) * (int)sVar20;
  uVar18 = 0xffffffffffffffff;
  if (-1 < iVar6) {
    uVar18 = (long)iVar6 * 8;
  }
  puVar10 = (ushort *)operator_new__(uVar18);
  local_4b0 = (Rgba *)(puVar10 + lVar16 * -4 + (long)(iVar5 * (int)sVar20) * -4);
  Imf_2_5::RgbaInputFile::setFrameBuffer(&local_478,local_4b0,1,sVar20);
  Imf_2_5::RgbaInputFile::readPixels(&local_478,(pBVar9->min).y,(pBVar9->max).y);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"generating preview image",0x18);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  iVar5 = 0;
  Imf_2_5::PreviewImage::PreviewImage(&local_4e0,0x80,0x40,(PreviewRgba *)0x0);
  PVar7.r = '\0';
  PVar7.g = '\0';
  PVar7.b = '\0';
  PVar7.a = 0x80;
  do {
    iVar6 = 0;
    PVar15 = PVar7;
    do {
      local_4e0._pixels[local_4e0._width * iVar5 + iVar6] = PVar15;
      iVar6 = iVar6 + 1;
      PVar15 = (PreviewRgba)((int)PVar15 + 0x10002);
    } while (iVar6 != 0x80);
    iVar5 = iVar5 + 1;
    PVar7 = (PreviewRgba)((int)PVar7 + 0x10400);
  } while (iVar5 != 0x40);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4a6370);
  }
  else {
    sVar11 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  pHVar8 = Imf_2_5::RgbaInputFile::header(&local_478);
  Imf_2_5::Header::Header((Header *)local_440,pHVar8);
  Imf_2_5::Header::setPreviewImage((Header *)local_440,&local_4e0);
  iVar5 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&local_238,(char *)__s,(Header *)local_440,WRITE_RGBA,iVar5);
  local_480 = sVar20;
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&local_238,local_4b0,1,sVar20);
  iVar5 = (pBVar9->min).y;
  if (iVar5 <= (pBVar9->max).y) {
    iVar5 = iVar5 + -1;
    do {
      Imf_2_5::RgbaOutputFile::writePixels(&local_238,1);
      iVar5 = iVar5 + 1;
    } while (iVar5 < (pBVar9->max).y);
  }
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&local_238);
  Imf_2_5::Header::~Header((Header *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"reading file ",0xd);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4a6370);
  }
  else {
    sVar11 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  iVar5 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaInputFile::RgbaInputFile((RgbaInputFile *)local_440,(char *)__s,iVar5);
  pHVar8 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)local_440);
  bVar4 = Imf_2_5::Header::hasPreviewImage(pHVar8);
  if (!bVar4) {
    __assert_fail("file2.header().hasPreviewImage()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                  ,0x82,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  pHVar8 = Imf_2_5::RgbaInputFile::header((RgbaInputFile *)local_440);
  pPVar12 = Imf_2_5::Header::previewImage(pHVar8);
  pPVar2 = pPVar12->_pixels;
  lVar16 = 0;
  do {
    if (local_4e0._pixels[lVar16].r != pPVar2[lVar16].r) {
      __assert_fail("preview1.pixels()[i].r == preview2.pixels()[i].r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x88,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (local_4e0._pixels[lVar16].g != pPVar2[lVar16].g) {
      __assert_fail("preview1.pixels()[i].g == preview2.pixels()[i].g",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x89,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (local_4e0._pixels[lVar16].b != pPVar2[lVar16].b) {
      __assert_fail("preview1.pixels()[i].b == preview2.pixels()[i].b",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x8a,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if (local_4e0._pixels[lVar16].a != pPVar2[lVar16].a) {
      __assert_fail("preview1.pixels()[i].a == preview2.pixels()[i].a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x8b,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x2000);
  pBVar13 = Imf_2_5::RgbaInputFile::dataWindow((RgbaInputFile *)local_440);
  local_488 = plVar3;
  iVar5 = (pBVar9->min).x;
  if ((((iVar5 != (pBVar13->min).x) || (iVar6 = (pBVar9->min).y, iVar6 != (pBVar13->min).y)) ||
      (iVar17 = (pBVar9->max).x, iVar17 != (pBVar13->max).x)) ||
     (iVar19 = (pBVar9->max).y, iVar19 != (pBVar13->max).y)) {
    __assert_fail("dw == file2.dataWindow()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                  ,0x8e,
                  "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                 );
  }
  iVar17 = (iVar17 - iVar5) + 1;
  iVar19 = ((iVar19 - iVar6) + 1) * iVar17;
  uVar18 = 0xffffffffffffffff;
  if (-1 < iVar19) {
    uVar18 = (long)iVar19 * 8;
  }
  puVar14 = (ushort *)operator_new__(uVar18);
  Imf_2_5::RgbaInputFile::setFrameBuffer
            ((RgbaInputFile *)local_440,
             (Rgba *)(puVar14 + (long)iVar5 * -4 + (long)(iVar6 * iVar17) * -4),1,(long)iVar17);
  Imf_2_5::RgbaInputFile::readPixels((RgbaInputFile *)local_440,(pBVar9->min).y,(pBVar9->max).y);
  sVar20 = local_480;
  plVar3 = local_488;
  if (0 < iVar19) {
    if ((half::_toFloat[*puVar10].f != half::_toFloat[*puVar14].f) ||
       (NAN(half::_toFloat[*puVar10].f) || NAN(half::_toFloat[*puVar14].f))) {
      __assert_fail("pixels1[i].r == pixels2[i].r",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x9b,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if ((half::_toFloat[puVar10[1]].f != half::_toFloat[puVar14[1]].f) ||
       (NAN(half::_toFloat[puVar10[1]].f) || NAN(half::_toFloat[puVar14[1]].f))) {
      __assert_fail("pixels1[i].g == pixels2[i].g",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x9c,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if ((half::_toFloat[puVar10[2]].f != half::_toFloat[puVar14[2]].f) ||
       (NAN(half::_toFloat[puVar10[2]].f) || NAN(half::_toFloat[puVar14[2]].f))) {
      __assert_fail("pixels1[i].b == pixels2[i].b",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x9d,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
    if ((half::_toFloat[puVar10[3]].f != half::_toFloat[puVar14[3]].f) ||
       (NAN(half::_toFloat[puVar10[3]].f) || NAN(half::_toFloat[puVar14[3]].f))) {
      __assert_fail("pixels1[i].a == pixels2[i].a",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0x9e,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
  }
  operator_delete__(puVar14);
  Imf_2_5::RgbaInputFile::~RgbaInputFile((RgbaInputFile *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing file ",0xd);
  if (plVar3 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4a6370);
  }
  else {
    sVar11 = strlen((char *)plVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)plVar3,sVar11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  pHVar8 = Imf_2_5::RgbaInputFile::header(&local_478);
  Imf_2_5::Header::Header((Header *)local_440,pHVar8);
  Imf_2_5::PreviewImage::PreviewImage((PreviewImage *)&local_238,0x80,0x40,(PreviewRgba *)0x0);
  Imf_2_5::Header::setPreviewImage((Header *)local_440,(PreviewImage *)&local_238);
  Imf_2_5::PreviewImage::~PreviewImage((PreviewImage *)&local_238);
  iVar5 = Imf_2_5::globalThreadCount();
  Imf_2_5::RgbaOutputFile::RgbaOutputFile
            (&local_238,(char *)plVar3,(Header *)local_440,WRITE_RGBA,iVar5);
  Imf_2_5::RgbaOutputFile::setFrameBuffer(&local_238,local_4b0,1,sVar20);
  iVar5 = (pBVar9->min).y;
  if (iVar5 <= (pBVar9->max).y) {
    do {
      Imf_2_5::RgbaOutputFile::writePixels(&local_238,1);
      iVar6 = (pBVar9->max).y;
      if (iVar5 == ((pBVar9->min).y + iVar6) / 2) {
        Imf_2_5::RgbaOutputFile::updatePreviewImage(&local_238,local_4e0._pixels);
        iVar6 = (pBVar9->max).y;
      }
      bVar4 = iVar5 < iVar6;
      iVar5 = iVar5 + 1;
    } while (bVar4);
  }
  Imf_2_5::RgbaOutputFile::~RgbaOutputFile(&local_238);
  Imf_2_5::Header::~Header((Header *)local_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"comparing files ",0x10);
  if (__s == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4a6370);
  }
  else {
    sVar11 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)__s,sVar11);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," and ",5);
  if (plVar3 == (long *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x4a6370);
  }
  else {
    sVar11 = strlen((char *)plVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,(char *)plVar3,sVar11);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  std::ifstream::ifstream(local_440);
  std::ifstream::ifstream(&local_238);
  std::filebuf::open(local_440 + 0x10,(_Ios_Openmode)__s);
  std::filebuf::open((char *)&local_238._toYca,(_Ios_Openmode)plVar3);
  while( true ) {
    iVar5 = std::istream::get();
    iVar6 = std::istream::get();
    if ((*(uint *)(*(_func_int **)(local_440._0_8_ + -0x18) + (long)(local_440 + 0x20)) & 2) != 0) {
      std::ifstream::~ifstream(&local_238);
      std::ifstream::~ifstream(local_440);
      remove((char *)__s);
      remove((char *)plVar3);
      Imf_2_5::PreviewImage::~PreviewImage(&local_4e0);
      operator_delete__(puVar10);
      Imf_2_5::RgbaInputFile::~RgbaInputFile(&local_478);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      if (local_4d0[0] != local_4c0) {
        operator_delete(local_4d0[0],local_4c0[0] + 1);
      }
      if (local_4a8[0] != local_498) {
        operator_delete(local_4a8[0],local_498[0] + 1);
      }
      return;
    }
    if (iVar5 != iVar6) break;
    if (((*(uint *)(*(_func_int **)(local_440._0_8_ + -0x18) + (long)(local_440 + 0x20)) & 5) != 0)
       || ((abStack_218[(long)local_238._vptr_RgbaOutputFile[-3]] & 5) != 0)) {
      __assert_fail("!!file2 && !!file3",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                    ,0xc6,
                    "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
                   );
    }
  }
  __assert_fail("c2 == c3",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testPreviewImage.cpp"
                ,0xc5,
                "void (anonymous namespace)::readWriteFiles(const char *, const char *, const char *)"
               );
}

Assistant:

void
testPreviewImage (const std::string &tempDir)
{
    std::string filename1 = tempDir + "imf_preview1.exr";
    std::string filename2 = tempDir + "imf_preview2.exr";

    try
    {
	cout << "Testing preview image attribute" << endl;

	readWriteFiles (ILM_IMF_TEST_IMAGEDIR "comp_piz.exr",
			filename1.c_str(),
			filename2.c_str());

	cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
	cerr << "ERROR -- caught exception: " << e.what() << endl;
	assert (false);
    }
}